

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  Solver *this;
  string local_38;
  
  this = (Solver *)operator_new(0x20);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"data/area_names/area_names_small.txt","");
  Solver::Solver(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main()
{
//	Solver *solver = new Solver("data/disease_names/disease_names.txt");
//	Solver *solver = new Solver("data/dept_names/dept_names.txt");
//	Solver *solver = new Solver("data/course_names/course_names.txt");
	Solver *solver = new Solver("data/area_names/area_names_small.txt");

//	Exp::preprocess();
//	Exp::varyDictionary();
//	Exp::varyThreshold();
//	Exp::varyMeasure();
//	Exp::calculateMeasurePRF();
//	Exp::calculateDictPRF();
//	Exp::check();
//	Exp::check2();
//	Exp::genDirty();
//	Exp::dictionary_scale();
//	Exp::joinalgo_scale();
//	Exp::show_datasets();
//	Exp::testRuleCompression();
//	Exp::genSubset()
//	Exp::genDBData(1);
	return 0;
}